

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

int __thiscall raspicam::_private::Private_Impl_Still::startCapture(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  uint uVar2;
  size_t sVar3;
  MMAL_BUFFER_HEADER_T *buffer;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  
  commitParameters(this);
  if (this->encoder_output_port->is_enabled == 0) {
    MVar1 = mmal_port_enable(this->encoder_output_port,buffer_callback);
    if (MVar1 == MMAL_SUCCESS) {
      uVar2 = mmal_queue_length(this->encoder_pool->queue);
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          buffer = mmal_queue_get(this->encoder_pool->queue);
          if (buffer == (MMAL_BUFFER_HEADER_T *)0x0) {
            pcVar6 = this->API_NAME;
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
            }
            else {
              sVar3 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,": Could not get buffer (#",0x19);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") from pool queue.\n",0x13);
          }
          MVar1 = mmal_port_send_buffer(this->encoder_output_port,buffer);
          if (MVar1 != MMAL_SUCCESS) {
            pcVar6 = this->API_NAME;
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
            }
            else {
              sVar3 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,": Could not send a buffer (#",0x1c);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,") to encoder output port.\n",0x1a);
          }
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      MVar1 = mmal_port_parameter_set_boolean(this->camera_still_port,0x10011,1);
      if (MVar1 == MMAL_SUCCESS) {
        return 0;
      }
      pcVar6 = this->API_NAME;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3);
      }
      pcVar6 = ": Failed to start capture.\n";
      lVar5 = 0x1b;
    }
    else {
      pcVar6 = this->API_NAME;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3);
      }
      pcVar6 = ": Could not enable encoder output port.\n";
      lVar5 = 0x28;
    }
  }
  else {
    pcVar6 = this->API_NAME;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3);
    }
    pcVar6 = 
    ": Could not enable encoder output port. Try waiting longer before attempting to take another picture.\n"
    ;
    lVar5 = 0x66;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  return -1;
}

Assistant:

int Private_Impl_Still::startCapture() {
            // If the parameters were changed and this function wasn't called, it will be called here
            // However if the parameters weren't changed, the function won't do anything - it will return right away
            commitParameters();

            if ( encoder_output_port->is_enabled ) {
                cout << API_NAME << ": Could not enable encoder output port. Try waiting longer before attempting to take another picture.\n";
                return -1;
            }
            if ( mmal_port_enable ( encoder_output_port, buffer_callback ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": Could not enable encoder output port.\n";
                return -1;
            }
            int num = mmal_queue_length ( encoder_pool->queue );
            for ( int b = 0; b < num; b++ ) {
                MMAL_BUFFER_HEADER_T *buffer = mmal_queue_get ( encoder_pool->queue );

                if ( !buffer )
                    cout << API_NAME << ": Could not get buffer (#" << b << ") from pool queue.\n";

                if ( mmal_port_send_buffer ( encoder_output_port, buffer ) != MMAL_SUCCESS )
                    cout << API_NAME << ": Could not send a buffer (#" << b << ") to encoder output port.\n";
            }
            if ( mmal_port_parameter_set_boolean ( camera_still_port, MMAL_PARAMETER_CAPTURE, 1 ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": Failed to start capture.\n";
                return -1;
            }
            return 0;
        }